

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float128 float64_to_float128_x86_64(float64 a,float_status *status)

{
  long lVar1;
  float64 a_00;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  float128 fVar6;
  commonNaNT local_20;
  
  a_00 = float64_squash_input_denormal_x86_64(a,status);
  uVar2 = a_00 & 0xfffffffffffff;
  uVar5 = a_00 & 0x8000000000000000;
  uVar4 = (uint)(a_00 >> 0x34) & 0x7ff;
  if (uVar4 == 0) {
    if (uVar2 != 0) {
      lVar1 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar4 = ((uint)lVar1 ^ 0x3f) + 0xf5;
      uVar2 = uVar2 << ((byte)uVar4 & 0x3f);
      uVar4 = -(uVar4 & 0xff);
      goto LAB_004a82fd;
    }
  }
  else {
    if (uVar4 != 0x7ff) {
LAB_004a82fd:
      uVar3 = uVar2 << 0x3c;
      uVar5 = (uVar2 >> 4 | uVar5) + ((ulong)(uVar4 + 0x3c00) << 0x30);
      goto LAB_004a835d;
    }
    if (uVar2 == 0) {
      uVar5 = a_00 | 0x7fff000000000000;
      uVar3 = 0;
      goto LAB_004a835d;
    }
    float64ToCommonNaN(&local_20,a_00,status);
    if (status->default_nan_mode == '\0') {
      uVar3 = local_20.low >> 0x10 | local_20.high << 0x30;
      uVar5 = (ulong)(uint)local_20._0_4_ << 0x3f | local_20.high >> 0x10 | 0x7fff000000000000;
      goto LAB_004a835d;
    }
    uVar5 = 0xffff800000000000;
  }
  uVar3 = 0;
LAB_004a835d:
  fVar6.high = uVar5;
  fVar6.low = uVar3;
  return fVar6;
}

Assistant:

float128 float64_to_float128(float64 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint64_t aSig, zSig0, zSig1;

    a = float64_squash_input_denormal(a, status);
    aSig = extractFloat64Frac( a );
    aExp = extractFloat64Exp( a );
    aSign = extractFloat64Sign( a );
    if ( aExp == 0x7FF ) {
        if (aSig) {
            return commonNaNToFloat128(float64ToCommonNaN(a, status), status);
        }
        return packFloat128( aSign, 0x7FFF, 0, 0 );
    }
    if ( aExp == 0 ) {
        if ( aSig == 0 ) return packFloat128( aSign, 0, 0, 0 );
        normalizeFloat64Subnormal( aSig, &aExp, &aSig );
        --aExp;
    }
    shift128Right( aSig, 0, 4, &zSig0, &zSig1 );
    return packFloat128( aSign, aExp + 0x3C00, zSig0, zSig1 );

}